

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

Node * __thiscall
TMap<FString,_int,_THashTraits<FString>,_TValueTraits<int>_>::FindKey
          (TMap<FString,_int,_THashTraits<FString>,_TValueTraits<int>_> *this,FString *key)

{
  bool bVar1;
  int iVar2;
  Node *pNVar3;
  bool bVar4;
  FString local_30;
  Node *local_28;
  Node *n;
  FString *pFStack_18;
  THashTraits<FString> Traits;
  FString *key_local;
  TMap<FString,_int,_THashTraits<FString>,_TValueTraits<int>_> *this_local;
  
  pFStack_18 = key;
  FString::FString(&local_30,key);
  pNVar3 = MainPosition(this,&local_30);
  FString::~FString(&local_30);
  local_28 = pNVar3;
  while( true ) {
    bVar4 = false;
    if (local_28 != (Node *)0x0) {
      bVar1 = Node::IsNil(local_28);
      bVar4 = false;
      if (!bVar1) {
        iVar2 = THashTraits<FString>::Compare
                          ((THashTraits<FString> *)((long)&n + 7),&(local_28->Pair).Key,key);
        bVar4 = iVar2 != 0;
      }
    }
    if (!bVar4) break;
    local_28 = local_28->Next;
  }
  if ((local_28 != (Node *)0x0) && (bVar4 = Node::IsNil(local_28), !bVar4)) {
    return local_28;
  }
  return (Node *)0x0;
}

Assistant:

Node *FindKey(const KT key)
	{
		HashTraits Traits;
		Node *n = MainPosition(key);
		while (n != NULL && !n->IsNil() && Traits.Compare(n->Pair.Key, key))
		{
			n = n->Next;
		}
		return n == NULL || n->IsNil() ? NULL : n;
	}